

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::LegacyDataSPKM::GetWatchPubKey(LegacyDataSPKM *this,CKeyID *address,CPubKey *pubkey_out)

{
  long lVar1;
  const_iterator cVar2;
  _Rb_tree_header *p_Var3;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock35;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock35,&(this->super_FillableSigningProvider).cs_KeyStore,"cs_KeyStore",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x41e,false);
  cVar2 = std::
          _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
          ::find(&(this->mapWatchKeys)._M_t,address);
  p_Var3 = &(this->mapWatchKeys)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar2._M_node != p_Var3) {
    memcpy(pubkey_out,(void *)((long)&cVar2._M_node[1]._M_left + 4),0x41);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock35.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (_Rb_tree_header *)cVar2._M_node != p_Var3;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyDataSPKM::GetWatchPubKey(const CKeyID &address, CPubKey &pubkey_out) const
{
    LOCK(cs_KeyStore);
    WatchKeyMap::const_iterator it = mapWatchKeys.find(address);
    if (it != mapWatchKeys.end()) {
        pubkey_out = it->second;
        return true;
    }
    return false;
}